

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

bool __thiscall Lexer::is_split_symbol(Lexer *this,char symbol)

{
  undefined3 in_register_00000031;
  uint uVar1;
  
  uVar1 = CONCAT31(in_register_00000031,symbol);
  if ((((0x3e < uVar1) || ((0x7800bf0500000600U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
      (uVar1 != 0x7b)) && (uVar1 != 0x7d)) {
    return false;
  }
  return true;
}

Assistant:

bool Lexer::is_split_symbol(char symbol)
{
	return symbol == '+' || symbol == '-' ||
		symbol == '/' || symbol == '*' ||
		symbol == '(' || symbol == ')' ||
		symbol == '{' || symbol == '}' ||
		symbol == '\"' || symbol == ',' ||
		symbol == ' ' || symbol == '=' ||
		symbol == '>' || symbol == '<' ||
		symbol == ';' ||
		symbol == 9 || // 9 - Horizontal Tabulation
		symbol == 10; // 10 - Line Feed (enter)
}